

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# observer.hpp
# Opt level: O0

void __thiscall
baryonyx::details::pi_file_observer::pi_file_observer
          (pi_file_observer *this,string_view filename,int m,int param_3,long param_4)

{
  string_view format_str;
  basic_string_view<char> bVar1;
  format_args args;
  string local_d0;
  long local_b0;
  long param_4_local;
  int param_3_local;
  int m_local;
  pi_file_observer *this_local;
  string_view filename_local;
  unsigned_long_long local_80;
  detail *local_78;
  char *local_70;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  local_68;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_50;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::basic_string_view<char,_std::char_traits<char>_>_>
  *vargs;
  char *local_40;
  string *local_38;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_30;
  char **local_28;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_20;
  char **local_18;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_10;
  
  filename_local._M_len = (size_t)filename._M_str;
  this_local = (pi_file_observer *)filename._M_len;
  this->constraints = m;
  local_40 = "{}-pi.txt";
  vargs = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::basic_string_view<char,_std::char_traits<char>_>_>
           *)&this_local;
  local_b0 = param_4;
  param_4_local._0_4_ = param_3;
  param_4_local._4_4_ = m;
  _param_3_local = this;
  local_38 = &local_d0;
  local_68.named_args.data =
       (named_arg_info<char> *)
       ::fmt::v7::
       make_args_checked<std::basic_string_view<char,std::char_traits<char>>const&,char[10],char>
                 ((format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::basic_string_view<char,_std::char_traits<char>_>_>
                   *)"{}-pi.txt",(v7 *)vargs,(char (*) [10])filename_local._M_len,
                  (remove_reference_t<const_std::basic_string_view<char>_&> *)(ulong)(uint)m);
  local_50 = &local_68;
  bVar1 = ::fmt::v7::to_string_view<char,_0>(local_40);
  local_28 = &filename_local._M_str;
  local_30 = local_50;
  local_20 = local_50;
  local_10 = local_50;
  local_18 = local_28;
  ::fmt::v7::
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>::
  basic_format_args((basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                     *)local_28,0xd,
                    (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                     *)&local_50->string);
  local_78 = (detail *)bVar1.data_;
  local_70 = (char *)bVar1.size_;
  format_str.size_ = (size_t)filename_local._M_str;
  format_str.data_ = local_70;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
              )(anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
                )param_4;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = local_80;
  ::fmt::v7::detail::vformat_abi_cxx11_(&local_d0,local_78,format_str,args);
  std::ofstream::ofstream(&this->m_ofs,(string *)&local_d0,_S_out);
  std::__cxx11::string::~string((string *)&local_d0);
  return;
}

Assistant:

pi_file_observer(const std::string_view filename,
                     int m,
                     int /*n*/,
                     long int /*loop*/)
      : constraints(m)
      , m_ofs(fmt::format("{}-pi.txt", filename))
    {}